

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  Nonnull<const_char_*> failure_msg;
  string *psVar2;
  int line;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  anon_enum_32 local_34;
  LogMessageFatal local_30;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_30.super_LogMessage.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
    local_34 = OPTIONAL_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_30,&local_34,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_30.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
      local_34 = 9;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_30,&local_34,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        psVar2 = (string *)(pEVar1->field_0).int64_t_value;
        goto LAB_0023a01d;
      }
    }
    line = 0x256;
  }
  else {
    pEVar1->type = type;
    local_30.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_34 = 9;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_30,&local_34,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_STRING");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pEVar1->is_repeated = false;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      psVar2 = Arena::Create<std::__cxx11::string>(this->arena_);
      (pEVar1->field_0).int64_t_value = (int64_t)psVar2;
LAB_0023a01d:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      return psVar2;
    }
    line = 0x251;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

std::string* ExtensionSet::MutableString(int number, FieldType type,
                                         const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->ptr.string_value = Arena::Create<std::string>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
  }
  extension->is_cleared = false;
  return extension->ptr.string_value;
}